

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

Node * __thiscall anon_unknown.dwarf_25095d::Db::parseFunctionType(Db *this)

{
  char *pcVar1;
  char *pcVar2;
  Node **ppNVar3;
  Node **ppNVar4;
  bool bVar5;
  Qualifiers QVar6;
  NameType *pNVar7;
  Node *pNVar8;
  undefined1 uVar9;
  NodeArray NVar10;
  StringView S;
  StringView S_00;
  StringView S_01;
  StringView S_02;
  StringView S_03;
  StringView S_04;
  Node *T;
  Qualifiers local_4c;
  size_t local_48;
  Node *local_40;
  NameType *local_38;
  
  QVar6 = parseCVQualifiers(this);
  S.Last = "";
  S.First = "Do";
  bVar5 = consumeIf(this,S);
  if (bVar5) {
    pNVar7 = (anonymous_namespace)::Db::make<(anonymous_namespace)::NameType,char_const(&)[9]>
                       ((Db *)this,(char (*) [9])"noexcept");
  }
  else {
    S_03.Last = "";
    S_03.First = "DO";
    bVar5 = consumeIf(this,S_03);
    if (bVar5) {
      pNVar8 = parseExpr(this);
      if (pNVar8 == (Node *)0x0) {
        return (Node *)0x0;
      }
      pcVar2 = this->First;
      if (pcVar2 == this->Last) {
        return (Node *)0x0;
      }
      if (*pcVar2 != 'E') {
        return (Node *)0x0;
      }
      this->First = pcVar2 + 1;
      pNVar7 = (NameType *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x18);
      (pNVar7->super_Node).K = KNoexceptSpec;
      (pNVar7->super_Node).RHSComponentCache = No;
      (pNVar7->super_Node).ArrayCache = No;
      (pNVar7->super_Node).FunctionCache = No;
      (pNVar7->super_Node)._vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_001c6878;
      (pNVar7->Name).First = (char *)pNVar8;
    }
    else {
      S_04.Last = "";
      S_04.First = "Dw";
      bVar5 = consumeIf(this,S_04);
      if (bVar5) {
        ppNVar3 = (this->Names).Last;
        ppNVar4 = (this->Names).First;
        while ((pcVar2 = this->First, pcVar2 == this->Last || (*pcVar2 != 'E'))) {
          T = parseType(this);
          if (T == (Node *)0x0) {
            return (Node *)0x0;
          }
          PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::push_back(&this->Names,&T);
        }
        this->First = pcVar2 + 1;
        NVar10 = popTrailingNodeArray(this,(long)ppNVar3 - (long)ppNVar4 >> 3);
        pNVar7 = (NameType *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
        (pNVar7->super_Node).K = KDynamicExceptionSpec;
        (pNVar7->super_Node).RHSComponentCache = No;
        (pNVar7->super_Node).ArrayCache = No;
        (pNVar7->super_Node).FunctionCache = No;
        (pNVar7->super_Node)._vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_001c68d0;
        (pNVar7->Name).First = (char *)NVar10.Elements;
        (pNVar7->Name).Last = (char *)NVar10.NumElements;
      }
      else {
        pNVar7 = (NameType *)0x0;
      }
    }
  }
  S_00.Last = "";
  S_00.First = "Dx";
  consumeIf(this,S_00);
  pcVar2 = this->First;
  if ((pcVar2 != this->Last) && (*pcVar2 == 'F')) {
    pcVar1 = pcVar2 + 1;
    this->First = pcVar1;
    if ((pcVar1 != this->Last) && (*pcVar1 == 'Y')) {
      this->First = pcVar2 + 2;
    }
    local_40 = parseType(this);
    if (local_40 != (Node *)0x0) {
      local_48 = (long)(this->Names).Last - (long)(this->Names).First >> 3;
      local_4c = QVar6;
      local_38 = pNVar7;
LAB_0017c263:
      while (pcVar2 = this->First, pcVar2 != this->Last) {
        if (*pcVar2 == 'E') {
          this->First = pcVar2 + 1;
          uVar9 = 0;
          goto LAB_0017c416;
        }
        if (*pcVar2 != 'v') break;
        this->First = pcVar2 + 1;
      }
      S_01.Last = "";
      S_01.First = "RE";
      bVar5 = consumeIf(this,S_01);
      if (bVar5) {
        uVar9 = 1;
      }
      else {
        S_02.Last = "";
        S_02.First = "OE";
        bVar5 = consumeIf(this,S_02);
        if (!bVar5) {
          T = parseType(this);
          if (T == (Node *)0x0) {
            return (Node *)0x0;
          }
          PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::push_back(&this->Names,&T);
          goto LAB_0017c263;
        }
        uVar9 = 2;
      }
LAB_0017c416:
      NVar10 = popTrailingNodeArray(this,local_48);
      pNVar8 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x38);
      pNVar8->K = KFunctionType;
      pNVar8->RHSComponentCache = Yes;
      pNVar8->ArrayCache = No;
      pNVar8->FunctionCache = Yes;
      pNVar8->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_001c6928;
      pNVar8[1]._vptr_Node = (_func_int **)local_40;
      *(NodeArray *)&pNVar8[1].K = NVar10;
      pNVar8[2].K = (undefined1)local_4c;
      pNVar8[2].RHSComponentCache = local_4c._1_1_;
      pNVar8[2].ArrayCache = local_4c._2_1_;
      pNVar8[2].FunctionCache = local_4c._3_1_;
      pNVar8[2].field_0xc = uVar9;
      pNVar8[3]._vptr_Node = (_func_int **)local_38;
      return pNVar8;
    }
  }
  return (Node *)0x0;
}

Assistant:

Node *Db::parseFunctionType() {
  Qualifiers CVQuals = parseCVQualifiers();

  Node *ExceptionSpec = nullptr;
  if (consumeIf("Do")) {
    ExceptionSpec = make<NameType>("noexcept");
  } else if (consumeIf("DO")) {
    Node *E = parseExpr();
    if (E == nullptr || !consumeIf('E'))
      return nullptr;
    ExceptionSpec = make<NoexceptSpec>(E);
  } else if (consumeIf("Dw")) {
    size_t SpecsBegin = Names.size();
    while (!consumeIf('E')) {
      Node *T = parseType();
      if (T == nullptr)
        return nullptr;
      Names.push_back(T);
    }
    ExceptionSpec =
      make<DynamicExceptionSpec>(popTrailingNodeArray(SpecsBegin));
  }

  consumeIf("Dx"); // transaction safe

  if (!consumeIf('F'))
    return nullptr;
  consumeIf('Y'); // extern "C"
  Node *ReturnType = parseType();
  if (ReturnType == nullptr)
    return nullptr;

  FunctionRefQual ReferenceQualifier = FrefQualNone;
  size_t ParamsBegin = Names.size();
  while (true) {
    if (consumeIf('E'))
      break;
    if (consumeIf('v'))
      continue;
    if (consumeIf("RE")) {
      ReferenceQualifier = FrefQualLValue;
      break;
    }
    if (consumeIf("OE")) {
      ReferenceQualifier = FrefQualRValue;
      break;
    }
    Node *T = parseType();
    if (T == nullptr)
      return nullptr;
    Names.push_back(T);
  }

  NodeArray Params = popTrailingNodeArray(ParamsBegin);
  return make<FunctionType>(ReturnType, Params, CVQuals,
                            ReferenceQualifier, ExceptionSpec);
}